

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

bool __thiscall
Reducer::shrinkByReduction<wasm::ElementSegment>(Reducer *this,ElementSegment *segment,size_t bonus)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  undefined1 local_60 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> save;
  
  bVar8 = *(long *)(segment + 0x40) == *(long *)(segment + 0x38);
  if (!bVar8) {
    save.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(segment + 0x38);
    uVar6 = 1;
    bVar2 = false;
    uVar7 = 0;
    do {
      if ((bVar2 != false) || (bVar1 = shouldTryToReduce(this,bonus), bVar1)) {
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_60,
                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   save.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (uVar6 != 0) {
          lVar4 = *(long *)(segment + 0x40);
          uVar5 = uVar6;
          do {
            if (lVar4 == *(long *)(segment + 0x38)) break;
            lVar4 = lVar4 + -8;
            *(long *)(segment + 0x40) = lVar4;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        bVar2 = writeAndTestReduction(this);
        if (bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"|      shrank segment from ",0x1b);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," => ",4);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," (skip: ",8);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
          this->reduced = this->reduced + 1;
          applyTestToWorking(this);
          uVar6 = uVar6 * 2;
          if ((ulong)(long)this->factor <= uVar6) {
            uVar6 = (long)this->factor;
          }
        }
        else {
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::_M_move_assign
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     save.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,local_60);
        }
        if (local_60 != (undefined1  [8])0x0) {
          operator_delete((void *)local_60,
                          (long)save.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)local_60);
        }
        if (!bVar2) {
          return bVar8;
        }
      }
      uVar7 = uVar7 + 1;
      lVar4 = *(long *)(segment + 0x40) - *(long *)(segment + 0x38);
      bVar1 = (ulong)(lVar4 >> 3) <= uVar7;
      bVar8 = bVar1 || lVar4 == 0;
    } while (!bVar1 && lVar4 != 0);
  }
  return bVar8;
}

Assistant:

bool shrinkByReduction(T* segment, size_t bonus) {
    // try to reduce to first function. first, shrink segment elements.
    // while we are shrinking successfully, keep going exponentially.
    bool justShrank = false;

    auto& data = segment->data;
    // when we succeed, try to shrink by more and more, similar to bisection
    size_t skip = 1;
    for (size_t i = 0; i < data.size() && !data.empty(); i++) {
      if (justShrank || shouldTryToReduce(bonus)) {
        auto save = data;
        for (size_t j = 0; j < skip; j++) {
          if (data.empty()) {
            break;
          } else {
            data.pop_back();
          }
        }
        justShrank = writeAndTestReduction();
        if (justShrank) {
          std::cerr << "|      shrank segment from " << save.size() << " => "
                    << data.size() << " (skip: " << skip << ")\n";
          noteReduction();
          skip = std::min(size_t(factor), 2 * skip);
        } else {
          data = std::move(save);
          return false;
        }
      }
    }

    return true;
  }